

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  pointer pMVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  pointer pMVar14;
  int q;
  float *pfVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  float *pfVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  float fVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  uVar23 = (ulong)uVar1;
  uVar10 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar21 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var2 = this->_vptr_Eltwise_x86;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == 0) {
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
          pfVar15 = (float *)(pMVar9[1].cstep * uVar12 * pMVar9[1].elemsize + (long)pMVar9[1].data);
          pauVar18 = (undefined1 (*) [16])
                     (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar10 < 4) {
            uVar11 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar28._0_4_ = *pfVar15 * *pfVar13;
              auVar28._4_4_ = pfVar15[1] * pfVar13[1];
              auVar28._8_4_ = pfVar15[2] * pfVar13[2];
              auVar28._12_4_ = pfVar15[3] * pfVar13[3];
              *pauVar18 = auVar28;
              pfVar13 = pfVar13 + 4;
              pfVar15 = pfVar15 + 4;
              pauVar18 = pauVar18 + 1;
              iVar21 = iVar21 + 4;
              uVar11 = uVar10 & 0xfffffffc;
            } while (iVar21 < (int)uVar10);
          }
          if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
            lVar22 = 0;
            do {
              *(float *)((long)*pauVar18 + lVar22 * 4) = pfVar15[lVar22] * pfVar13[lVar22];
              lVar22 = lVar22 + 1;
            } while (uVar10 - uVar11 != (int)lVar22);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar23);
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (2 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7)) {
        uVar12 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar9 = pMVar9 + uVar12;
            uVar16 = 0;
            do {
              pfVar13 = (float *)(pMVar9->cstep * uVar16 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar18 = (undefined1 (*) [16])
                         (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
              uVar11 = 0;
              if (3 < (int)uVar10) {
                iVar21 = 3;
                do {
                  auVar25._0_4_ = *pfVar13 * *(float *)*pauVar18;
                  auVar25._4_4_ = pfVar13[1] * *(float *)((long)*pauVar18 + 4);
                  auVar25._8_4_ = pfVar13[2] * *(float *)((long)*pauVar18 + 8);
                  auVar25._12_4_ = pfVar13[3] * *(float *)((long)*pauVar18 + 0xc);
                  *pauVar18 = auVar25;
                  pfVar13 = pfVar13 + 4;
                  pauVar18 = pauVar18 + 1;
                  iVar21 = iVar21 + 4;
                  uVar11 = uVar10 & 0xfffffffc;
                } while (iVar21 < (int)uVar10);
              }
              if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
                lVar22 = 0;
                do {
                  *(float *)((long)*pauVar18 + lVar22 * 4) =
                       *(float *)((long)*pauVar18 + lVar22 * 4) * pfVar13[lVar22];
                  lVar22 = lVar22 + 1;
                } while (uVar10 - uVar11 != (int)lVar22);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar23);
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == 1) {
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)pp_Var2[-3]) == 0) {
        if (0 < (int)uVar1) {
          uVar12 = 0;
          do {
            pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
            pfVar15 = (float *)(pMVar9[1].cstep * uVar12 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
            pauVar18 = (undefined1 (*) [16])
                       (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar10 < 4) {
              uVar11 = 0;
            }
            else {
              iVar21 = 3;
              do {
                auVar26._0_4_ = *pfVar15 + *pfVar13;
                auVar26._4_4_ = pfVar15[1] + pfVar13[1];
                auVar26._8_4_ = pfVar15[2] + pfVar13[2];
                auVar26._12_4_ = pfVar15[3] + pfVar13[3];
                *pauVar18 = auVar26;
                pfVar13 = pfVar13 + 4;
                pfVar15 = pfVar15 + 4;
                pauVar18 = pauVar18 + 1;
                iVar21 = iVar21 + 4;
                uVar11 = uVar10 & 0xfffffffc;
              } while (iVar21 < (int)uVar10);
            }
            if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
              lVar22 = 0;
              do {
                *(float *)((long)*pauVar18 + lVar22 * 4) = pfVar15[lVar22] + pfVar13[lVar22];
                lVar22 = lVar22 + 1;
              } while (uVar10 - uVar11 != (int)lVar22);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar23);
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7)) {
          uVar12 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar9 = pMVar9 + uVar12;
              uVar16 = 0;
              do {
                pfVar13 = (float *)(pMVar9->cstep * uVar16 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar18 = (undefined1 (*) [16])
                           (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
                uVar11 = 0;
                if (3 < (int)uVar10) {
                  iVar21 = 3;
                  do {
                    auVar27._0_4_ = *pfVar13 + *(float *)*pauVar18;
                    auVar27._4_4_ = pfVar13[1] + *(float *)((long)*pauVar18 + 4);
                    auVar27._8_4_ = pfVar13[2] + *(float *)((long)*pauVar18 + 8);
                    auVar27._12_4_ = pfVar13[3] + *(float *)((long)*pauVar18 + 0xc);
                    *pauVar18 = auVar27;
                    pfVar13 = pfVar13 + 4;
                    pauVar18 = pauVar18 + 1;
                    iVar21 = iVar21 + 4;
                    uVar11 = uVar10 & 0xfffffffc;
                  } while (iVar21 < (int)uVar10);
                }
                if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
                  lVar22 = 0;
                  do {
                    *(float *)((long)*pauVar18 + lVar22 * 4) =
                         *(float *)((long)*pauVar18 + lVar22 * 4) + pfVar13[lVar22];
                    lVar22 = lVar22 + 1;
                  } while (uVar10 - uVar11 != (int)lVar22);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar23);
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar12 = 0;
          do {
            pfVar13 = (float *)(m->cstep * uVar12 * m->elemsize + (long)m->data);
            pfVar15 = (float *)(pMVar9[1].cstep * uVar12 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
            pfVar19 = (float *)(this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
            fVar24 = (float)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var2[-3]);
            fVar29 = (float)((ulong)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var2[-3]) >> 0x20
                            );
            if ((int)uVar10 < 4) {
              uVar11 = 0;
            }
            else {
              iVar21 = 3;
              do {
                fVar3 = pfVar13[1];
                fVar4 = pfVar13[2];
                fVar5 = pfVar13[3];
                fVar6 = pfVar15[1];
                fVar7 = pfVar15[2];
                fVar8 = pfVar15[3];
                *pfVar19 = *pfVar15 * fVar29 + *pfVar13 * fVar24;
                pfVar19[1] = fVar6 * fVar29 + fVar3 * fVar24;
                pfVar19[2] = fVar7 * fVar29 + fVar4 * fVar24;
                pfVar19[3] = fVar8 * fVar29 + fVar5 * fVar24;
                pfVar13 = pfVar13 + 4;
                pfVar15 = pfVar15 + 4;
                pfVar19 = pfVar19 + 4;
                iVar21 = iVar21 + 4;
                uVar11 = uVar10 & 0xfffffffc;
              } while (iVar21 < (int)uVar10);
            }
            if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
              lVar22 = 0;
              do {
                pfVar19[lVar22] = pfVar15[lVar22] * fVar29 + pfVar13[lVar22] * fVar24;
                lVar22 = lVar22 + 1;
              } while (uVar10 - uVar11 != (int)lVar22);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar23);
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7)) {
          pp_Var2 = this->_vptr_Eltwise_x86;
          uVar12 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar9 = pMVar9 + uVar12;
              uVar16 = 0;
              do {
                pfVar13 = (float *)(pMVar9->cstep * uVar16 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar15 = (float *)(this_00->cstep * uVar16 * this_00->elemsize +
                                   (long)this_00->data);
                fVar24 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var2[-3]) + uVar12 * 4);
                uVar11 = 0;
                if (3 < (int)uVar10) {
                  iVar21 = 3;
                  do {
                    fVar29 = pfVar13[1];
                    fVar3 = pfVar13[2];
                    fVar4 = pfVar13[3];
                    *pfVar15 = *pfVar13 * fVar24 + *pfVar15;
                    pfVar15[1] = fVar29 * fVar24 + pfVar15[1];
                    pfVar15[2] = fVar3 * fVar24 + pfVar15[2];
                    pfVar15[3] = fVar4 * fVar24 + pfVar15[3];
                    pfVar13 = pfVar13 + 4;
                    pfVar15 = pfVar15 + 4;
                    iVar21 = iVar21 + 4;
                    uVar11 = uVar10 & 0xfffffffc;
                  } while (iVar21 < (int)uVar10);
                }
                if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
                  lVar22 = 0;
                  do {
                    pfVar15[lVar22] = pfVar13[lVar22] * fVar24 + pfVar15[lVar22];
                    lVar22 = lVar22 + 1;
                  } while (uVar10 - uVar11 != (int)lVar22);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar23);
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar21 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 2) {
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          pauVar18 = (undefined1 (*) [16])(m->cstep * uVar12 * m->elemsize + (long)m->data);
          pauVar17 = (undefined1 (*) [16])
                     (pMVar9[1].cstep * uVar12 * pMVar9[1].elemsize + (long)pMVar9[1].data);
          pauVar20 = (undefined1 (*) [16])
                     (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar10 < 4) {
            uVar11 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar28 = maxps(*pauVar18,*pauVar17);
              *pauVar20 = auVar28;
              pauVar18 = pauVar18 + 1;
              pauVar17 = pauVar17 + 1;
              pauVar20 = pauVar20 + 1;
              iVar21 = iVar21 + 4;
              uVar11 = uVar10 & 0xfffffffc;
            } while (iVar21 < (int)uVar10);
          }
          if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
            lVar22 = 0;
            do {
              fVar24 = *(float *)(*pauVar17 + lVar22 * 4);
              if (*(float *)(*pauVar17 + lVar22 * 4) <= *(float *)(*pauVar18 + lVar22 * 4)) {
                fVar24 = *(float *)(*pauVar18 + lVar22 * 4);
              }
              *(float *)((long)*pauVar20 + lVar22 * 4) = fVar24;
              lVar22 = lVar22 + 1;
            } while (uVar10 - uVar11 != (int)lVar22);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar23);
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      iVar21 = 0;
      if (2 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7)) {
        uVar12 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar9 = pMVar9 + uVar12;
            uVar16 = 0;
            do {
              pauVar18 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar16 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar17 = (undefined1 (*) [16])
                         (this_00->cstep * uVar16 * this_00->elemsize + (long)this_00->data);
              uVar11 = 0;
              if (3 < (int)uVar10) {
                iVar21 = 3;
                do {
                  auVar28 = maxps(*pauVar17,*pauVar18);
                  *pauVar17 = auVar28;
                  pauVar18 = pauVar18 + 1;
                  pauVar17 = pauVar17 + 1;
                  iVar21 = iVar21 + 4;
                  uVar11 = uVar10 & 0xfffffffc;
                } while (iVar21 < (int)uVar10);
              }
              if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
                lVar22 = 0;
                do {
                  fVar24 = *(float *)(*pauVar17 + lVar22 * 4);
                  if (*(float *)(*pauVar17 + lVar22 * 4) <= *(float *)(*pauVar18 + lVar22 * 4)) {
                    fVar24 = *(float *)(*pauVar18 + lVar22 * 4);
                  }
                  *(float *)(*pauVar17 + lVar22 * 4) = fVar24;
                  lVar22 = lVar22 + 1;
                } while (uVar10 - uVar11 != (int)lVar22);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar23);
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(((long)pMVar14 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        iVar21 = 0;
      }
    }
  }
  return iVar21;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}